

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleEndKeywordsDirective(Preprocessor *this,Token directive)

{
  pointer pKVar1;
  Token directive_00;
  SourceRange range;
  Trivia TVar2;
  Token local_18;
  
  local_18.info = directive.info;
  local_18._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  pKVar1 = (this->keywordVersionStack).
           super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pKVar1 -
      (long)(this->keywordVersionStack).
            super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
            ._M_impl.super__Vector_impl_data._M_start == 1) {
    range = Token::range(&local_18);
    Diagnostics::add(this->diagnostics,(DiagCode)0x120004,range);
  }
  else {
    (this->keywordVersionStack).
    super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1 + -1;
  }
  directive_00.info = local_18.info;
  directive_00.kind = local_18.kind;
  directive_00._2_1_ = local_18._2_1_;
  directive_00.numFlags.raw = local_18.numFlags.raw;
  directive_00.rawLen = local_18.rawLen;
  TVar2 = createSimpleDirective(this,directive_00);
  TVar2._8_8_ = TVar2._8_8_ & 0xffffffffffff;
  return TVar2;
}

Assistant:

Trivia Preprocessor::handleEndKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    if (keywordVersionStack.size() == 1)
        addDiag(diag::MismatchedEndKeywordsDirective, directive.range());
    else
        keywordVersionStack.pop_back();

    return createSimpleDirective(directive);
}